

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_4::Validator::OnAtomicRmwExpr(Validator *this,AtomicRmwExpr *expr)

{
  Opcode opcode;
  Result RVar1;
  Address alignment;
  Var VStack_78;
  
  opcode.enum_ = (expr->opcode).enum_;
  Var::Var(&VStack_78,&(expr->super_MemoryExpr<(wabt::ExprType)1>).memidx);
  alignment = Opcode::GetAlignment(&expr->opcode,expr->align);
  RVar1 = SharedValidator::OnAtomicRmw
                    (&this->validator_,
                     &(expr->super_MemoryExpr<(wabt::ExprType)1>).super_ExprMixin<(wabt::ExprType)1>
                      .super_Expr.loc,opcode,&VStack_78,alignment,expr->offset);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&VStack_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnAtomicRmwExpr(AtomicRmwExpr* expr) {
  result_ |= validator_.OnAtomicRmw(expr->loc, expr->opcode, expr->memidx,
                                    expr->opcode.GetAlignment(expr->align),
                                    expr->offset);
  return Result::Ok;
}